

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_access_col_block(Integer s_a,Integer icol,void *idx,void *jdx,void *val)

{
  Integer proc;
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long *ptr;
  Integer hi;
  Integer ld;
  int64_t *tljdx;
  int64_t *tlidx;
  int *tjdx;
  int *tidx;
  Integer lo;
  char *lptr;
  Integer local_a0;
  long local_98;
  long *local_90;
  long *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  Integer local_48;
  Integer local_40;
  long local_38;
  
  lVar3 = s_a + 1000;
  lVar1 = -1;
  if (0 < SPA[lVar3].nblocks) {
    lVar4 = 0;
    do {
      lVar1 = lVar4;
      if (SPA[lVar3].blkidx[lVar4] == icol) break;
      lVar4 = lVar4 + 1;
      lVar1 = -1;
    } while (SPA[lVar3].nblocks != lVar4);
  }
  if (lVar1 == -1) {
    *(undefined8 *)idx = 0;
    *(undefined8 *)jdx = 0;
    *(undefined8 *)val = 0;
  }
  else {
    lVar4 = SPA[lVar3].idx_size;
    local_90 = (long *)idx;
    local_88 = (long *)jdx;
    local_80 = (long *)val;
    local_50 = lVar4;
    proc = pnga_pgroup_nodeid(SPA[lVar3].grp);
    local_48 = SPA[lVar3].offset[lVar1];
    pnga_distribution(SPA[lVar3].g_data,proc,&local_40,&local_a0);
    pnga_access_ptr(SPA[lVar3].g_data,&local_40,&local_a0,&local_38,&local_78);
    pnga_distribution(SPA[lVar3].g_i,proc,&local_40,&local_a0);
    plVar2 = &local_58;
    if (lVar4 == 8) {
      plVar2 = &local_68;
    }
    ptr = &local_60;
    if (lVar4 == 8) {
      ptr = &local_70;
    }
    local_98 = lVar1;
    pnga_access_ptr(SPA[lVar3].g_i,&local_40,&local_a0,plVar2,&local_78);
    pnga_distribution(SPA[lVar3].g_j,proc,&local_40,&local_a0);
    pnga_access_ptr(SPA[lVar3].g_j,&local_40,&local_a0,ptr,&local_78);
    local_78 = (SPA[lVar3].ihi - SPA[lVar3].ilo) + 2;
    local_38 = SPA[lVar3].size * local_48 + local_38;
    if (local_50 == 8) {
      local_70 = local_70 + local_48 * 8;
      lVar1 = local_78 * local_98 * 8 + local_68;
      local_68 = lVar1;
      plVar2 = &local_70;
    }
    else {
      local_60 = local_60 + (long)(int)local_48 * 4;
      lVar1 = (long)((int)local_98 * (int)local_78) * 4 + local_58;
      local_58 = lVar1;
      plVar2 = &local_60;
    }
    *local_90 = lVar1;
    *local_88 = *plVar2;
    *local_80 = local_38;
    pnga_release(SPA[lVar3].g_data,&local_40,&local_a0);
    pnga_release(SPA[lVar3].g_i,&local_40,&local_a0);
    pnga_release(SPA[lVar3].g_j,&local_40,&local_a0);
  }
  return;
}

Assistant:

void pnga_sprs_array_access_col_block(Integer s_a, Integer icol,
    void *idx, void *jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  char *lptr;
  Integer i,index;
  Integer longidx;
  if (SPA[hdl].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  index = -1;
  for (i=0; i<SPA[hdl].nblocks; i++) {
    if (SPA[hdl].blkidx[i] == icol) {
      index = i;
      break;
    }
  }
  if (index == -1) {
    if (longidx) {
      *(int**)idx = NULL;
      *(int**)jdx = NULL;
    } else {
      *(int64_t**)idx = NULL;
      *(int64_t**)jdx = NULL;
    }
    *(char**)val = NULL;
  }  else {
    int *tidx;
    int *tjdx;
    int64_t *tlidx;
    int64_t *tljdx;
    char *lptr;
    Integer lo, hi, ld;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
    Integer offset = SPA[hdl].offset[index];

    /* access local portions of GAs containing data */
    pnga_distribution(SPA[hdl].g_data,me,&lo,&hi);
    pnga_access_ptr(SPA[hdl].g_data,&lo,&hi,&lptr,&ld);
    pnga_distribution(SPA[hdl].g_i,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tlidx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tidx,&ld);
    }
    pnga_distribution(SPA[hdl].g_j,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tljdx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tjdx,&ld);
    }
    /* shift pointers to correct location */
    ld = SPA[hdl].ihi - SPA[hdl].ilo + 2;
    lptr = lptr + offset*SPA[hdl].size;
    if (longidx) {
      tljdx = tljdx + (int64_t)offset;
      tlidx = tlidx + (int64_t)(ld*index);
      *(int64_t**)idx = tlidx;
      *(int64_t**)jdx = tljdx;
    } else {
      tjdx = tjdx + (int)offset;
      tidx = tidx + (int)(ld*index);
      *(int**)idx = tidx;
      *(int**)jdx = tjdx;
    }
    *(char**)val = lptr;
    pnga_release(SPA[hdl].g_data,&lo,&hi);
    pnga_release(SPA[hdl].g_i,&lo,&hi);
    pnga_release(SPA[hdl].g_j,&lo,&hi);
  }
}